

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O0

optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> * __thiscall
ear::Triplet::handle
          (optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *__return_storage_ptr__,Triplet *this,
          Vector3d *position)

{
  Scalar *pSVar1;
  Scalar local_100;
  Scalar local_f8;
  CwiseBinaryOp<Eigen::internal::scalar_max_op<double,_double,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_f0;
  CwiseBinaryOp<Eigen::internal::scalar_min_op<double,_double,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_max_op<double,_double,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_c8;
  Matrix<double,__1,_1,_0,__1,_1> local_78;
  RealScalar local_68 [3];
  double local_50;
  double epsilon;
  Product<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>
  local_40;
  undefined1 local_30 [8];
  VectorXd pv;
  Vector3d *position_local;
  Triplet *this_local;
  
  pv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       (Index)position;
  epsilon = (double)Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                              ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)position);
  local_40 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>::operator*
                       ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>> *)&epsilon,
                        (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&this->_basis);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>,Eigen::Matrix<double,3,3,0,3,3>,0>>
            ((Matrix<double,_1,1,0,_1,1> *)local_30,
             (EigenBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
              *)&local_40);
  local_50 = -1e-11;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_30,0);
  if (local_50 <= *pSVar1) {
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_30,1);
    if (local_50 <= *pSVar1) {
      pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_30,2);
      if (local_50 <= *pSVar1) {
        local_68[0] = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::norm
                                ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_30);
        Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator/=
                  ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_30,local_68);
        local_f8 = 0.0;
        Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::cwiseMax
                  (&local_f0,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_30,
                   &local_f8);
        local_100 = 1.0;
        Eigen::
        MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_max_op<double,_double,_0>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
        ::cwiseMin(&local_c8,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_max_op<double,_double,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                    *)&local_f0,&local_100);
        Eigen::
        DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_min_op<double,_double,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_max_op<double,_double,_0>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
        ::eval((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_min_op<double,_double,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_max_op<double,_double,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                *)&local_78);
        boost::optional<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::optional
                  (__return_storage_ptr__,&local_78);
        Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_78);
        goto LAB_001ddbc8;
      }
    }
  }
  boost::optional<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::optional(__return_storage_ptr__);
LAB_001ddbc8:
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

boost::optional<Eigen::VectorXd> Triplet::handle(
      Eigen::Vector3d position) const {
    Eigen::VectorXd pv = position.transpose() * _basis;
    double epsilon = -1e-11;
    if (pv(0) >= epsilon && pv(1) >= epsilon && pv(2) >= epsilon) {
      pv /= pv.norm();
      return pv.cwiseMax(0.0).cwiseMin(1.0).eval();
    }
    return boost::none;
  }